

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O3

pointer __thiscall
slang::SmallVectorBase<slang::ast::RandSeqProductionSymbol::Rule>::
emplaceRealloc<slang::ast::RandSeqProductionSymbol::Rule>
          (SmallVectorBase<slang::ast::RandSeqProductionSymbol::Rule> *this,pointer pos,Rule *args)

{
  pointer pRVar1;
  ulong uVar2;
  pointer pRVar3;
  pointer pRVar4;
  long lVar5;
  long lVar6;
  pointer pRVar7;
  ulong uVar8;
  pointer pRVar9;
  pointer pRVar10;
  pointer pRVar11;
  size_type sVar12;
  long lVar13;
  byte bVar14;
  
  bVar14 = 0;
  if (this->len == 0x1c71c71c71c71c7) {
    detail::throwLengthError();
  }
  uVar8 = this->len + 1;
  uVar2 = this->cap;
  if (uVar8 < uVar2 * 2) {
    uVar8 = uVar2 * 2;
  }
  if (0x1c71c71c71c71c7 - uVar2 < uVar2) {
    uVar8 = 0x1c71c71c71c71c7;
  }
  lVar13 = (long)pos - (long)this->data_;
  pRVar3 = (pointer)operator_new(uVar8 * 0x48);
  pRVar1 = (pointer)((long)pRVar3 + lVar13);
  pRVar10 = pRVar1;
  for (lVar5 = 9; lVar5 != 0; lVar5 = lVar5 + -1) {
    (pRVar10->ruleBlock).ptr = (args->ruleBlock).ptr;
    args = (Rule *)((long)args + (ulong)bVar14 * -0x10 + 8);
    pRVar10 = (pointer)((long)pRVar10 + (ulong)bVar14 * -0x10 + 8);
  }
  pRVar10 = this->data_;
  sVar12 = this->len;
  lVar5 = (long)pRVar10 + (sVar12 * 0x48 - (long)pos);
  pRVar4 = pRVar10;
  pRVar7 = pRVar3;
  if (lVar5 == 0) {
    pRVar4 = pRVar3;
    pRVar7 = pRVar10;
    if (sVar12 != 0) {
      do {
        pRVar9 = pRVar7;
        pRVar11 = pRVar4;
        for (lVar5 = 9; lVar5 != 0; lVar5 = lVar5 + -1) {
          (pRVar11->ruleBlock).ptr = (pRVar9->ruleBlock).ptr;
          pRVar9 = (pointer)((long)pRVar9 + (ulong)bVar14 * -0x10 + 8);
          pRVar11 = (pointer)((long)pRVar11 + ((ulong)bVar14 * -2 + 1) * 8);
        }
        pRVar7 = pRVar7 + 1;
        pRVar4 = pRVar4 + 1;
      } while (pRVar7 != pos);
    }
  }
  else {
    for (; pRVar4 != pos; pRVar4 = pRVar4 + 1) {
      pRVar9 = pRVar4;
      pRVar11 = pRVar7;
      for (lVar6 = 9; lVar6 != 0; lVar6 = lVar6 + -1) {
        (pRVar11->ruleBlock).ptr = (pRVar9->ruleBlock).ptr;
        pRVar9 = (pointer)((long)pRVar9 + (ulong)bVar14 * -0x10 + 8);
        pRVar11 = (pointer)((long)pRVar11 + ((ulong)bVar14 * -2 + 1) * 8);
      }
      pRVar7 = pRVar7 + 1;
    }
    memcpy((void *)((long)pRVar3 + lVar13 + 0x48),pos,((lVar5 - 0x48U) / 0x48) * 0x48 + 0x48);
  }
  if (pRVar10 != (pointer)this->firstElement) {
    operator_delete(pRVar10);
    sVar12 = this->len;
  }
  this->len = sVar12 + 1;
  this->cap = uVar8;
  this->data_ = pRVar3;
  return pRVar1;
}

Assistant:

typename SmallVectorBase<T>::pointer SmallVectorBase<T>::emplaceRealloc(const pointer pos,
                                                                        Args&&... args) {
    if (len == max_size())
        detail::throwLengthError();

    auto newCap = calculateGrowth(len + 1);
    auto offset = static_cast<size_type>(pos - begin());
    auto newData = (pointer)::operator new(newCap * sizeof(T));

    // First construct the new element in the new memory,
    // so that we don't corrupt the new element if it relied on
    // existing elements we're about to move around.
    auto newPos = newData + offset;
    new (newPos) T(std::forward<Args>(args)...);

    // Now move elements to the new memory.
    if (pos == end()) {
        std::uninitialized_move(begin(), end(), newData);
    }
    else {
        std::uninitialized_move(begin(), pos, newData);
        std::uninitialized_move(pos, end(), newPos + 1);
    }

    cleanup();
    len++;
    cap = newCap;
    data_ = newData;
    return newPos;
}